

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

_Bool menu_handle_keypress(menu_conflict *menu,ui_event *in,ui_event *out)

{
  uint uVar1;
  keycode_t kVar2;
  int iVar3;
  char *pcVar4;
  byte bVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  wchar_t wVar9;
  ui_event_type uVar10;
  int *piVar11;
  __int32_t **pp_Var12;
  ushort **ppuVar13;
  ui_event uVar18;
  uint8_t extraout_DL;
  uint uVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  char c;
  int n;
  
  piVar11 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar11 = &menu->count;
  }
  uVar1 = *piVar11;
  uVar16 = (ulong)in->mouse >> 0x20;
  uVar14 = menu->flags;
  if ((uVar14 & 8) != 0) {
    pp_Var12 = __ctype_toupper_loc();
    uVar16 = (ulong)(uint)(*pp_Var12)[uVar16 & 0xff];
  }
  if (((uVar14 & 0x40) != 0) &&
     (ppuVar13 = __ctype_b_loc(), (*(byte *)((long)*ppuVar13 + (uVar16 & 0xff) * 2 + 1) & 8) != 0))
  {
    uVar7 = (uint)(byte)menu->inscriptions[(uint)uVar16 - 0x30];
    if (menu->inscriptions[(uint)uVar16 - 0x30] == 0) {
      uVar7 = (uint)uVar16;
    }
    uVar16 = (ulong)uVar7;
  }
  if ((uVar14 & 2) == 0) {
    bVar15 = (byte)uVar16;
    if ((uVar14 & 1) != 0) {
      uVar16 = 0;
      iVar8 = 0;
      if (0 < (int)uVar1) {
        uVar16 = (ulong)uVar1;
        iVar8 = 0;
      }
      for (; (int)uVar16 != iVar8; iVar8 = iVar8 + 1) {
        bVar5 = (*menu->skin->get_tag)(menu,iVar8);
        if (((menu->flags & 8) != 0) && (bVar5 != 0)) {
          pp_Var12 = __ctype_toupper_loc();
          bVar5 = *(byte *)(*pp_Var12 + bVar5);
        }
        if ((bVar5 != 0) && (bVar15 == bVar5)) {
          uVar16 = (ulong)(uint)(iVar8 + menu->top);
          goto LAB_001e5615;
        }
      }
      goto LAB_001e563b;
    }
    if (((uVar14 & 4) == 0) && (pcVar4 = menu->selections, pcVar4 != (char *)0x0)) {
      uVar16 = 0;
      while( true ) {
        bVar5 = pcVar4[uVar16];
        if ((ulong)bVar5 == 0) break;
        if ((uVar14 & 8) != 0) {
          pp_Var12 = __ctype_toupper_loc();
          bVar5 = *(byte *)(*pp_Var12 + bVar5);
        }
        if (bVar15 == bVar5) goto LAB_001e5615;
        uVar16 = uVar16 + 1;
      }
      goto LAB_001e563b;
    }
    if (menu->row_funcs->get_tag == (_func_char_menu_ptr_int *)0x0) goto LAB_001e563b;
    uVar17 = 0;
    uVar16 = 0;
    if (0 < (int)uVar1) {
      uVar16 = (ulong)uVar1;
    }
    do {
      if (uVar16 == uVar17) goto LAB_001e563b;
      if (menu->filter_list == (int *)0x0) {
        iVar8 = (int)uVar17;
      }
      else {
        iVar8 = menu->filter_list[uVar17];
      }
      bVar5 = (*menu->row_funcs->get_tag)(menu,iVar8);
      if (((menu->flags & 8) != 0) && (bVar5 != 0)) {
        pp_Var12 = __ctype_toupper_loc();
        bVar5 = *(byte *)(*pp_Var12 + bVar5);
      }
      uVar17 = uVar17 + 1;
    } while ((bVar5 == 0) || (bVar15 != bVar5));
    uVar16 = (ulong)((int)uVar17 - 1);
LAB_001e5615:
    iVar8 = (int)uVar16;
    if ((iVar8 < 0) || (_Var6 = is_valid_row(menu,iVar8), !_Var6)) goto LAB_001e563b;
    if ((menu->flags & 0x10) == 0) {
      uVar10 = EVT_SELECT;
    }
    else {
      uVar10 = (uint)(iVar8 == menu->cursor) * 0x20 + EVT_MOVE;
    }
    out->type = uVar10;
    menu->cursor = iVar8;
  }
  else {
LAB_001e563b:
    kVar2 = (in->key).code;
    if (kVar2 == 0xe000) {
      out->type = EVT_ESCAPE;
    }
    else {
      uVar14 = 1;
      if ((int)uVar1 < 1) goto LAB_001e5763;
      if (kVar2 == 0x9c) {
        out->type = EVT_SELECT;
      }
      else {
        if (kVar2 == 0x20) {
          iVar8 = (menu->active).page_rows;
          if (iVar8 < (int)uVar1) {
            iVar8 = iVar8 + menu->cursor;
            uVar14 = 0;
            if ((int)(uVar1 - 1) <= iVar8) {
              iVar8 = 0;
            }
            menu->cursor = iVar8;
            menu->top = iVar8;
            out->type = EVT_MOVE;
          }
          goto LAB_001e5763;
        }
        wVar9 = target_dir(in->key);
        uVar14 = 0;
        if (wVar9 == L'\0') goto LAB_001e5763;
        do {
          uVar7 = uVar14;
          if (uVar1 == uVar7) goto LAB_001e5654;
          _Var6 = is_valid_row(menu,uVar7);
          uVar14 = uVar7 + 1;
        } while (!_Var6);
        if ((int)uVar7 < (int)uVar1) {
          uVar18._0_8_ = (*menu->skin->process_dir)(menu,wVar9);
          out->mouse = uVar18.mouse;
          (out->key).mods = extraout_DL;
          if (uVar18.mouse.type == EVT_MOVE) {
            iVar8 = menu->cursor;
            while( true ) {
              _Var6 = is_valid_row(menu,iVar8);
              iVar3 = menu->cursor;
              if (_Var6) break;
              iVar8 = 0;
              if ((iVar3 < (int)uVar1) && (iVar8 = uVar1 - 1, -1 < iVar3)) {
                iVar8 = iVar3 + ddy[wVar9];
              }
              menu->cursor = iVar8;
            }
            if (iVar3 < 0) {
              __assert_fail("menu->cursor >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                            ,0x2ec,
                            "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)"
                           );
            }
            if ((int)uVar1 <= iVar3) {
              __assert_fail("menu->cursor < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                            ,0x2ed,
                            "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)"
                           );
            }
          }
        }
      }
    }
  }
LAB_001e5654:
  uVar14 = 0;
LAB_001e5763:
  return SUB41(uVar14,0);
}

Assistant:

bool menu_handle_keypress(struct menu *menu, const ui_event *in,
		ui_event *out)
{
	bool eat = false;
	int count = menu->filter_list ? menu->filter_count : menu->count;

	/* Get the new cursor position from the menu item tags */
	int new_cursor = get_cursor_key(menu, menu->top, in->key);
	if (new_cursor >= 0 && is_valid_row(menu, new_cursor)) {
		if (!(menu->flags & MN_DBL_TAP) || new_cursor == menu->cursor)
			out->type = EVT_SELECT;
		else
			out->type = EVT_MOVE;

		menu->cursor = new_cursor;
	} else if (in->key.code == ESCAPE) {
		/* Escape stops us here */
		out->type = EVT_ESCAPE;
	} else if (count <= 0) {
		/* Menus with no rows can't be navigated or used, so eat keypresses */
		eat = true;
	} else if (in->key.code == ' ') {
		/* Try existing, known keys */
		int rows = menu->active.page_rows;
		int total = count;

		if (rows < total) {
			/* Go to start of next page */
			menu->cursor += menu->active.page_rows;
			if (menu->cursor >= total - 1) menu->cursor = 0;
			menu->top = menu->cursor;
	
			out->type = EVT_MOVE;
		} else {
			eat = true;
		}
	} else if (in->key.code == KC_ENTER) {
		out->type = EVT_SELECT;
	} else {
		/* Try directional movement */
		int dir = target_dir(in->key);

		if (dir && !no_valid_row(menu, count)) {
			*out = menu->skin->process_dir(menu, dir);

			if (out->type == EVT_MOVE) {
				while (!is_valid_row(menu, menu->cursor)) {
					/* Loop around */
					if (menu->cursor > count - 1)
						menu->cursor = 0;
					else if (menu->cursor < 0)
						menu->cursor = count - 1;
					else
						menu->cursor += ddy[dir];
				}
			
				assert(menu->cursor >= 0);
				assert(menu->cursor < count);
			}
		}
	}

	return eat;
}